

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lda_core.cc
# Opt level: O1

void ldamath::vexpdigammify(vw *all,float *gamma,float underflow_threshold)

{
  undefined1 (*pauVar1) [16];
  uint uVar2;
  ulong uVar3;
  float *pfVar4;
  float fVar5;
  undefined1 (*pauVar6) [16];
  undefined1 (*pauVar7) [16];
  undefined1 (*pauVar8) [16];
  float fVar9;
  float fVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  float fVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  float fVar17;
  undefined1 auVar18 [16];
  float fVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  float fVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  undefined1 auVar34 [16];
  float fVar35;
  float fVar36;
  
  uVar2 = all->lda;
  pauVar1 = (undefined1 (*) [16])(gamma + uVar2);
  fVar14 = 0.0;
  pauVar6 = (undefined1 (*) [16])gamma;
  if (((ulong)gamma & 0xf) != 0 && (ulong)uVar2 != 0) {
    pfVar4 = gamma + 1;
    do {
      fVar17 = *(float *)*pauVar6;
      fVar23 = fVar17 + 2.0;
      fVar9 = (float)((uint)fVar23 & 0x7fffff | 0x3f000000);
      fVar14 = fVar14 + fVar17;
      auVar18._4_4_ = 0x3fdce9a3;
      auVar18._0_4_ = fVar17 * 6.0 + 13.0;
      auVar18._8_8_ = 0;
      auVar16._0_4_ = fVar23 * 12.0 * fVar23;
      auVar16._4_4_ = fVar9 + 0.35208872;
      auVar16._8_8_ = 0;
      auVar18 = divps(auVar18,auVar16);
      *(float *)*pauVar6 =
           ((fVar9 * -1.4980303 + (float)(uint)fVar23 * 1.1920929e-07 + -124.22545) - auVar18._4_4_)
           * 0.6931472 + (-(fVar17 + fVar17 + 1.0) / ((fVar17 + 1.0) * fVar17) - auVar18._0_4_);
      pauVar6 = (undefined1 (*) [16])((long)*pauVar6 + 4);
      if (pauVar1 <= pauVar6) break;
      uVar3 = (ulong)pfVar4 & 0xf;
      pfVar4 = pfVar4 + 1;
    } while (uVar3 != 0);
  }
  auVar16 = _DAT_002762b0;
  fVar17 = 0.0;
  fVar9 = 0.0;
  fVar23 = 0.0;
  fVar19 = 0.0;
  pauVar8 = pauVar6;
  auVar18 = _DAT_00276230;
  if (pauVar6 + 1 < pauVar1 && ((ulong)pauVar6 & 0xf) == 0) {
    do {
      fVar35 = *(float *)*pauVar6;
      fVar5 = *(float *)((long)*pauVar6 + 4);
      fVar10 = *(float *)((long)*pauVar6 + 8);
      fVar36 = *(float *)((long)*pauVar6 + 0xc);
      fVar17 = fVar17 + fVar35;
      fVar9 = fVar9 + fVar5;
      fVar23 = fVar23 + fVar10;
      fVar19 = fVar19 + fVar36;
      fVar26 = fVar35 + 2.0;
      fVar28 = fVar5 + 2.0;
      fVar30 = fVar10 + 2.0;
      fVar32 = fVar36 + 2.0;
      fVar27 = (float)((uint)fVar26 & 0x7fffff | 0x3f000000);
      fVar29 = (float)((uint)fVar28 & 0x7fffff | 0x3f000000);
      fVar31 = (float)((uint)fVar30 & 0x7fffff | 0x3f000000);
      fVar33 = (float)((uint)fVar32 & 0x7fffff | 0x3f000000);
      auVar25._0_4_ = fVar27 + 0.35208872;
      auVar25._4_4_ = fVar29 + 0.35208872;
      auVar25._8_4_ = fVar31 + 0.35208872;
      auVar25._12_4_ = fVar33 + 0.35208872;
      auVar25 = divps(auVar16,auVar25);
      auVar24._0_4_ = ((fVar35 * -30.0 + -127.0) * fVar35 + -157.0) * fVar35 + -48.0;
      auVar24._4_4_ = ((fVar5 * -30.0 + -127.0) * fVar5 + -157.0) * fVar5 + -48.0;
      auVar24._8_4_ = ((fVar10 * -30.0 + -127.0) * fVar10 + -157.0) * fVar10 + -48.0;
      auVar24._12_4_ = ((fVar36 * -30.0 + -127.0) * fVar36 + -157.0) * fVar36 + -48.0;
      auVar21._4_4_ = (fVar5 + 1.0) * fVar5 * 12.0 * fVar28 * fVar28;
      auVar21._0_4_ = (fVar35 + 1.0) * fVar35 * 12.0 * fVar26 * fVar26;
      auVar21._8_4_ = (fVar10 + 1.0) * fVar10 * 12.0 * fVar30 * fVar30;
      auVar21._12_4_ = (fVar36 + 1.0) * fVar36 * 12.0 * fVar32 * fVar32;
      auVar18 = divps(auVar24,auVar21);
      *(float *)*pauVar6 =
           auVar18._0_4_ +
           (auVar25._0_4_ + fVar27 * -1.4980303 + (float)(int)fVar26 * 1.1920929e-07 + -124.22552) *
           0.6931472;
      *(float *)((long)*pauVar6 + 4) =
           auVar18._4_4_ +
           (auVar25._4_4_ + fVar29 * -1.4980303 + (float)(int)fVar28 * 1.1920929e-07 + -124.22552) *
           0.6931472;
      *(float *)((long)*pauVar6 + 8) =
           auVar18._8_4_ +
           (auVar25._8_4_ + fVar31 * -1.4980303 + (float)(int)fVar30 * 1.1920929e-07 + -124.22552) *
           0.6931472;
      *(float *)((long)*pauVar6 + 0xc) =
           auVar18._12_4_ +
           (auVar25._12_4_ + fVar33 * -1.4980303 + (float)(int)fVar32 * 1.1920929e-07 + -124.22552)
           * 0.6931472;
      pauVar8 = pauVar6 + 1;
      pauVar7 = pauVar6 + 2;
      pauVar6 = pauVar8;
      auVar18 = _DAT_00276230;
    } while (pauVar7 < pauVar1);
  }
  for (; auVar16 = _DAT_00276230, pauVar8 < pauVar1;
      pauVar8 = (undefined1 (*) [16])((long)*pauVar8 + 4)) {
    fVar35 = *(float *)*pauVar8;
    fVar10 = fVar35 + 2.0;
    fVar5 = (float)((uint)fVar10 & 0x7fffff | 0x3f000000);
    fVar14 = fVar14 + fVar35;
    auVar20._4_12_ = DAT_00276230._4_12_;
    auVar20._0_4_ = fVar35 * 6.0 + 13.0;
    auVar22._0_4_ = fVar10 * 12.0 * fVar10;
    auVar22._4_4_ = fVar5 + 0.35208872;
    auVar22._8_8_ = 0;
    auVar21 = divps(auVar20,auVar22);
    _DAT_00276230 = auVar18;
    *(float *)*pauVar8 =
         ((fVar5 * -1.4980303 + (float)(uint)fVar10 * 1.1920929e-07 + -124.22545) - auVar21._4_4_) *
         0.6931472 + (-(fVar35 + fVar35 + 1.0) / ((fVar35 + 1.0) * fVar35) - auVar21._0_4_);
    auVar18 = _DAT_00276230;
    _DAT_00276230 = auVar16;
  }
  fVar14 = fVar19 + fVar23 + fVar9 + fVar17 + fVar14;
  fVar9 = fVar14 + 2.0;
  fVar17 = (float)((uint)fVar9 & 0x7fffff | 0x3f000000);
  auVar11._0_4_ = fVar9 * 12.0 * fVar9;
  auVar11._4_4_ = fVar17 + 0.35208872;
  auVar11._8_8_ = 0;
  auVar15._4_12_ = auVar18._4_12_;
  auVar15._0_4_ = fVar14 * 6.0 + 13.0;
  auVar16 = divps(auVar15,auVar11);
  fVar14 = ((fVar17 * -1.4980303 + (float)(uint)fVar9 * 1.1920929e-07 + -124.22545) - auVar16._4_4_)
           * 0.6931472 + (-(fVar14 + fVar14 + 1.0) / ((fVar14 + 1.0) * fVar14) - auVar16._0_4_);
  _DAT_00276230 = auVar18;
  if (((ulong)gamma & 0xf) != 0 && uVar2 != 0) {
    pfVar4 = gamma + 1;
    do {
      fVar9 = (*(float *)*(undefined1 (*) [16])gamma - fVar14) * 1.442695;
      fVar17 = -126.0;
      if (-126.0 <= fVar9) {
        fVar17 = fVar9;
      }
      fVar9 = (fVar17 - (float)(int)fVar17) + (float)(-(uint)(fVar9 < 0.0) & 0x3f800000);
      fVar9 = (float)(long)((fVar9 * -1.4901291 +
                            27.728024 / (4.8425255 - fVar9) + fVar17 + 121.274086) * 8388608.0);
      fVar17 = fVar9;
      if (fVar9 <= underflow_threshold) {
        fVar17 = underflow_threshold;
      }
      *(uint *)*(undefined1 (*) [16])gamma =
           ~-(uint)NAN(underflow_threshold) & (uint)fVar17 |
           -(uint)NAN(underflow_threshold) & (uint)fVar9;
      gamma = (float *)((long)*(undefined1 (*) [16])gamma + 4);
    } while ((gamma < pauVar1) && (uVar3 = (ulong)pfVar4 & 0xf, pfVar4 = pfVar4 + 1, uVar3 != 0));
  }
  auVar18 = _DAT_00276370;
  if ((undefined1 (*) [16])((long)gamma + 0x10) < pauVar1 && ((ulong)gamma & 0xf) == 0) {
    auVar34._4_4_ = underflow_threshold;
    auVar34._0_4_ = underflow_threshold;
    pauVar6 = (undefined1 (*) [16])gamma;
    do {
      fVar17 = (*(float *)*pauVar6 - fVar14) * 1.442695;
      fVar9 = (*(float *)((long)*pauVar6 + 4) - fVar14) * 1.442695;
      fVar23 = (*(float *)((long)*pauVar6 + 8) - fVar14) * 1.442695;
      fVar19 = (*(float *)((long)*pauVar6 + 0xc) - fVar14) * 1.442695;
      fVar35 = (float)(~-(uint)(fVar17 < -126.0) & (uint)(fVar17 + 0.0) |
                      -(uint)(fVar17 < -126.0) & 0xc2fc0000);
      fVar5 = (float)(~-(uint)(fVar9 < -126.0) & (uint)(fVar9 + 0.0) |
                     -(uint)(fVar9 < -126.0) & 0xc2fc0000);
      fVar10 = (float)(~-(uint)(fVar23 < -126.0) & (uint)(fVar23 + 0.0) |
                      -(uint)(fVar23 < -126.0) & 0xc2fc0000);
      fVar36 = (float)(~-(uint)(fVar19 < -126.0) & (uint)(fVar19 + 0.0) |
                      -(uint)(fVar19 < -126.0) & 0xc2fc0000);
      fVar17 = (fVar35 - (float)(int)fVar35) + (float)(-(uint)(fVar17 < 0.0) & 0x3f800000);
      fVar9 = (fVar5 - (float)(int)fVar5) + (float)(-(uint)(fVar9 < 0.0) & 0x3f800000);
      fVar23 = (fVar10 - (float)(int)fVar10) + (float)(-(uint)(fVar23 < 0.0) & 0x3f800000);
      fVar19 = (fVar36 - (float)(int)fVar36) + (float)(-(uint)(fVar19 < 0.0) & 0x3f800000);
      auVar12._0_4_ = 4.8425255 - fVar17;
      auVar12._4_4_ = 4.8425255 - fVar9;
      auVar12._8_4_ = 4.8425255 - fVar23;
      auVar12._12_4_ = 4.8425255 - fVar19;
      auVar16 = divps(auVar18,auVar12);
      auVar13._0_4_ = (int)((fVar17 * -1.4901291 + auVar16._0_4_ + fVar35 + 121.274086) * 8388608.0)
      ;
      auVar13._4_4_ = (int)((fVar9 * -1.4901291 + auVar16._4_4_ + fVar5 + 121.274086) * 8388608.0);
      auVar13._8_4_ = (int)((fVar23 * -1.4901291 + auVar16._8_4_ + fVar10 + 121.274086) * 8388608.0)
      ;
      auVar13._12_4_ =
           (int)((fVar19 * -1.4901291 + auVar16._12_4_ + fVar36 + 121.274086) * 8388608.0);
      auVar34._8_4_ = underflow_threshold;
      auVar34._12_4_ = underflow_threshold;
      auVar16 = maxps(auVar34,auVar13);
      *pauVar6 = auVar16;
      gamma = (float *)(pauVar6 + 1);
      pauVar8 = pauVar6 + 2;
      pauVar6 = (undefined1 (*) [16])gamma;
    } while (pauVar8 < pauVar1);
  }
  if (gamma < pauVar1) {
    do {
      fVar9 = (*(float *)*(undefined1 (*) [16])gamma - fVar14) * 1.442695;
      fVar17 = -126.0;
      if (-126.0 <= fVar9) {
        fVar17 = fVar9;
      }
      fVar9 = (fVar17 - (float)(int)fVar17) + (float)(-(uint)(fVar9 < 0.0) & 0x3f800000);
      fVar9 = (float)(long)((fVar9 * -1.4901291 +
                            27.728024 / (4.8425255 - fVar9) + fVar17 + 121.274086) * 8388608.0);
      fVar17 = fVar9;
      if (fVar9 <= underflow_threshold) {
        fVar17 = underflow_threshold;
      }
      *(uint *)*(undefined1 (*) [16])gamma =
           ~-(uint)NAN(underflow_threshold) & (uint)fVar17 |
           -(uint)NAN(underflow_threshold) & (uint)fVar9;
      gamma = (float *)((long)*(undefined1 (*) [16])gamma + 4);
    } while (gamma < pauVar1);
  }
  return;
}

Assistant:

void vexpdigammify(vw &all, float *gamma, const float underflow_threshold)
{
  float extra_sum = 0.0f;
  v4sf sum = v4sfl(0.0f);
  float *fp;
  const float *fpend = gamma + all.lda;

  // Iterate through the initial part of the array that isn't 128-bit SIMD
  // aligned.
  for (fp = gamma; fp < fpend && !is_aligned16(fp); ++fp)
  {
    extra_sum += *fp;
    *fp = fastdigamma(*fp);
  }

  // Rip through the aligned portion...
  for (; is_aligned16(fp) && fp + 4 < fpend; fp += 4)
  {
    v4sf arg = _mm_load_ps(fp);
    sum = sum + arg;
    arg = vfastdigamma(arg);
    _mm_store_ps(fp, arg);
  }

  for (; fp < fpend; ++fp)
  {
    extra_sum += *fp;
    *fp = fastdigamma(*fp);
  }

#if defined(__SSE3__) || defined(__SSE4_1__)
  // Do two horizontal adds on sum, extract the total from the 0 element:
  sum = _mm_hadd_ps(sum, sum);
  sum = _mm_hadd_ps(sum, sum);
  extra_sum += v4sf_index<0>(sum);
#else
  extra_sum += v4sf_index<0>(sum) + v4sf_index<1>(sum) + v4sf_index<2>(sum) + v4sf_index<3>(sum);
#endif

  extra_sum = fastdigamma(extra_sum);
  sum = v4sfl(extra_sum);

  for (fp = gamma; fp < fpend && !is_aligned16(fp); ++fp)
  {
    *fp = fmax(underflow_threshold, fastexp(*fp - extra_sum));
  }

  for (; is_aligned16(fp) && fp + 4 < fpend; fp += 4)
  {
    v4sf arg = _mm_load_ps(fp);
    arg = arg - sum;
    arg = vfastexp(arg);
    arg = _mm_max_ps(v4sfl(underflow_threshold), arg);
    _mm_store_ps(fp, arg);
  }

  for (; fp < fpend; ++fp)
  {
    *fp = fmax(underflow_threshold, fastexp(*fp - extra_sum));
  }
}